

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O2

string * cmrc::detail::normalize_path(string *__return_storage_ptr__,string *path)

{
  long lVar1;
  
  while (lVar1 = std::__cxx11::string::find((char *)path,0x10402a), lVar1 == 0) {
    std::__cxx11::string::erase(path,(path->_M_dataplus)._M_p);
  }
  while ((path->_M_string_length != 0 &&
         (lVar1 = std::__cxx11::string::rfind((char *)path,0x10402a),
         lVar1 == path->_M_string_length - 1))) {
    std::__cxx11::string::pop_back();
  }
  while (lVar1 = std::__cxx11::string::find((char *)path,0x104029), lVar1 != -1) {
    std::__cxx11::string::erase(path,(path->_M_dataplus)._M_p + lVar1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

inline std::string normalize_path(std::string path) {
    while (path.find("/") == 0) {
        path.erase(path.begin());
    }
    while (!path.empty() && (path.rfind("/") == path.size() - 1)) {
        path.pop_back();
    }
    auto off = path.npos;
    while ((off = path.find("//")) != path.npos) {
        path.erase(path.begin() + static_cast<std::string::difference_type>(off));
    }
    return path;
}